

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O2

string * string_from_frame_abi_cxx11_(string *__return_storage_ptr__,frame *f)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&f->addr,&f->func);
  std::operator+(&bStack_58,&local_38,&f->data);
  std::operator+(__return_storage_ptr__,&bStack_58,&f->crc);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string string_from_frame(frame &f) {
	return f.addr + f.func + f.data + f.crc;
}